

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O3

void __thiscall Fl_Browser_::swapping(Fl_Browser_ *this,void *a,void *b)

{
  void *pvVar1;
  bool bVar2;
  
  redraw_line(this,a);
  redraw_line(this,b);
  pvVar1 = b;
  if ((this->selection_ == a) || (pvVar1 = a, this->selection_ == b)) {
    this->selection_ = pvVar1;
  }
  if ((this->top_ == a) || (bVar2 = this->top_ == b, b = a, bVar2)) {
    this->top_ = b;
  }
  return;
}

Assistant:

void Fl_Browser_::swapping(void* a, void* b) {
  redraw_line(a);
  redraw_line(b);
  if (a == selection_) selection_ = b;
  else if (b == selection_) selection_ = a;
  if (a == top_) top_ = b;
  else if (b == top_) top_ = a;
}